

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithAttributes(Gia_Man_t *p)

{
  Gia_Man_t *p_00;
  Tim_Man_t *pTVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  
  p_00 = Gia_ManDup(p);
  Gia_ManTransferMapping(p_00,p);
  Gia_ManTransferPacking(p_00,p);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar1 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar1;
  }
  if (p->pAigExtra != (Gia_Man_t *)0x0) {
    pGVar2 = Gia_ManDup(p->pAigExtra);
    p_00->pAigExtra = pGVar2;
  }
  if (p->nAnd2Delay != 0) {
    p_00->nAnd2Delay = p->nAnd2Delay;
  }
  if (p->vRegClasses != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vRegClasses);
    p_00->vRegClasses = pVVar3;
  }
  if (p->vRegInits != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vRegInits);
    p_00->vRegInits = pVVar3;
  }
  if (p->vConfigs != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vConfigs);
    p_00->vConfigs = pVVar3;
  }
  if (p->pCellStr != (char *)0x0) {
    pcVar4 = Abc_UtilStrsav(p->pCellStr);
    p_00->pCellStr = pcVar4;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithAttributes( Gia_Man_t * p )
{
    Gia_Man_t * pNew = Gia_ManDup(p);
    Gia_ManTransferMapping( pNew, p );
    Gia_ManTransferPacking( pNew, p );
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    if ( p->pAigExtra )
        pNew->pAigExtra = Gia_ManDup( p->pAigExtra );
    if ( p->nAnd2Delay )
        pNew->nAnd2Delay = p->nAnd2Delay;
    if ( p->vRegClasses )
        pNew->vRegClasses = Vec_IntDup( p->vRegClasses );
    if ( p->vRegInits )
        pNew->vRegInits = Vec_IntDup( p->vRegInits );
    if ( p->vConfigs )
        pNew->vConfigs = Vec_IntDup( p->vConfigs );
    if ( p->pCellStr )
        pNew->pCellStr = Abc_UtilStrsav( p->pCellStr );
    return pNew;
}